

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O2

int AF_DBlockThingsIterator_Create
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  bool bVar1;
  DBlockThingsIterator *this;
  int iVar2;
  char *pcVar3;
  AActor *origin;
  double local_38;
  
  if (numparam < 1) {
    pcVar3 = "(paramnum) < numparam";
    goto LAB_0042386d;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_0042385d:
    pcVar3 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_0042386d;
  }
  origin = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (origin == (AActor *)0x0) goto LAB_0042376a;
LAB_0042377e:
    bVar1 = DObject::IsKindOf((DObject *)origin,AActor::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar3 = "origin == NULL || origin->IsKindOf(RUNTIME_CLASS(AActor))";
LAB_0042386d:
      __assert_fail(pcVar3,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                    ,0x4b8,
                    "int AF_DBlockThingsIterator_Create(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  else {
    if (origin != (AActor *)0x0) goto LAB_0042385d;
LAB_0042376a:
    NullParam("\"origin\"");
    origin = (AActor *)(param->field_0).field_1.a;
    if (origin != (AActor *)0x0) goto LAB_0042377e;
    origin = (AActor *)0x0;
  }
  if (numparam == 1) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type != '\x01') {
      pcVar3 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_004238d3:
      __assert_fail(pcVar3,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                    ,0x4b9,
                    "int AF_DBlockThingsIterator_Create(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_38 = param[1].field_0.f;
  }
  else {
    if (param[1].field_0.field_3.Type != '\x01') {
      pcVar3 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_004238d3;
    }
    local_38 = param[1].field_0.f;
    if (2 < (uint)numparam) {
      if (param[2].field_0.field_3.Type != '\0') {
        pcVar3 = "(param[paramnum]).Type == REGT_INT";
        goto LAB_0042388c;
      }
      goto LAB_00423803;
    }
    param = defaultparam->Array;
  }
  if (param[2].field_0.field_3.Type != '\0') {
    pcVar3 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_0042388c:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                  ,0x4ba,
                  "int AF_DBlockThingsIterator_Create(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_00423803:
  iVar2 = param[2].field_0.i;
  this = (DBlockThingsIterator *)DObject::operator_new(0x218);
  DBlockThingsIterator::DBlockThingsIterator(this,origin,local_38,iVar2 != 0);
  if (numret < 1) {
    iVar2 = 0;
  }
  else {
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                    ,0x4bb,
                    "int AF_DBlockThingsIterator_Create(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar2 = 1;
    VMReturn::SetPointer(ret,this,1);
  }
  return iVar2;
}

Assistant:

DEFINE_ACTION_FUNCTION(DBlockThingsIterator, Create)
{
	PARAM_PROLOGUE;
	PARAM_OBJECT_NOT_NULL(origin, AActor);
	PARAM_FLOAT_DEF(radius);
	PARAM_BOOL_DEF(ignore);
	ACTION_RETURN_OBJECT(new DBlockThingsIterator(origin, radius, ignore));
}